

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O2

int str_rep(lua_State *L)

{
  char *s;
  ulong uVar1;
  size_t l;
  luaL_Buffer b;
  
  s = luaL_checklstring(L,1,&l);
  uVar1 = luaL_checkinteger(L,2);
  luaL_buffinit(L,&b);
  for (; 0 < (int)uVar1; uVar1 = (ulong)((int)uVar1 - 1)) {
    luaL_addlstring(&b,s,l);
  }
  luaL_pushresult(&b);
  return 1;
}

Assistant:

static int str_rep (lua_State *L) {
  size_t l;
  luaL_Buffer b;
  const char *s = luaL_checklstring(L, 1, &l);
  int n = luaL_checkint(L, 2);
  luaL_buffinit(L, &b);
  while (n-- > 0)
    luaL_addlstring(&b, s, l);
  luaL_pushresult(&b);
  return 1;
}